

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

CeilLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_ceil(NeuralNetworkLayer *this)

{
  CeilLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x299) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x299;
    this_00 = (CeilLayerParams *)operator_new(0x18);
    CeilLayerParams::CeilLayerParams(this_00);
    (this->layer_).ceil_ = this_00;
  }
  return (CeilLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::CeilLayerParams* NeuralNetworkLayer::mutable_ceil() {
  if (!has_ceil()) {
    clear_layer();
    set_has_ceil();
    layer_.ceil_ = new ::CoreML::Specification::CeilLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.ceil)
  return layer_.ceil_;
}